

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferOperationsViaFrambufferReadBack::initializeBufferObjectData
          (TextureBufferOperationsViaFrambufferReadBack *this)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  GLint GVar7;
  uint uVar8;
  undefined4 extraout_var;
  TestError *pTVar10;
  char *this_00;
  vector<int,_std::allocator<int>_> data;
  string vsSource;
  string fsSource;
  char *vsCode;
  char *fsCode;
  GLfloat vertices [16];
  long lVar9;
  
  iVar4 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,(ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture
                                << 2),(allocator_type *)vertices);
  (*(this->super_TextureBufferOperations).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])
            (this,data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start,
             (ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture << 2)
            );
  (**(code **)(lVar9 + 0x708))(1,&this->m_fb_vao_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error generating vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x35c);
  (**(code **)(lVar9 + 0xd8))(this->m_fb_vao_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x35f);
  pGVar1 = &this->m_fb_fbo_id;
  (**(code **)(lVar9 + 0x6d0))(1,pGVar1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error genertaing framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x363);
  (**(code **)(lVar9 + 0x78))(0x8ca9,*pGVar1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error binding framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x366);
  pGVar2 = &this->m_fb_to_id;
  (**(code **)(lVar9 + 0x6f8))(1,pGVar2);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x36a);
  (**(code **)(lVar9 + 0xb8))(0xde1,*pGVar2);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x36d);
  (**(code **)(lVar9 + 0x1380))
            (0xde1,1,0x8d82,(this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture,1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error allocating texture object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x370);
  (**(code **)(lVar9 + 0x6a0))(0x8ca9,0x8ce0,0xde1,*pGVar2,0);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error attaching texture to framebuffer\'s color attachment!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x374);
  TextureBufferOperations::checkFramebufferStatus(&this->super_TextureBufferOperations,0x8ca9);
  (**(code **)(lVar9 + 0x1a00))
            (0,0,(this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture,1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error setting viewport!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x37b);
  GVar6 = (**(code **)(lVar9 + 0x3c8))();
  this->m_fb_po_id = GVar6;
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x37f);
  GVar6 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
  this->m_fb_fs_id = GVar6;
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error creating fragment shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x382);
  GVar6 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
  this->m_fb_vs_id = GVar6;
  dVar5 = (**(code **)(lVar9 + 0x800))();
  this_00 = "Error creating vertex shader object!";
  glu::checkError(dVar5,"Error creating vertex shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x385);
  getFBFragmentShaderCode_abi_cxx11_
            (&fsSource,(TextureBufferOperationsViaFrambufferReadBack *)this_00);
  getFBVertexShaderCode_abi_cxx11_
            (&vsSource,(TextureBufferOperationsViaFrambufferReadBack *)this_00);
  fsCode = fsSource._M_dataplus._M_p;
  vsCode = vsSource._M_dataplus._M_p;
  bVar3 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,this->m_fb_po_id,this->m_fb_fs_id,1,&fsCode,
                     this->m_fb_vs_id,1,&vsCode,(bool *)0x0);
  if (!bVar3) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Could not create a program from valid vertex/fragment shader code!",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
               ,0x38f);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  vertices._48_8_ = &DAT_3f8000003f800000;
  vertices[0xe] = 0.0;
  vertices[0xf] = 1.0;
  vertices[8] = 1.0;
  vertices[9] = -1.0;
  vertices[10] = 0.0;
  vertices[0xb] = 1.0;
  vertices[4] = -1.0;
  vertices[5] = 1.0;
  vertices[6] = 0.0;
  vertices[7] = 1.0;
  vertices[0] = -1.0;
  vertices[1] = -1.0;
  vertices[2] = 0.0;
  vertices[3] = 1.0;
  (**(code **)(lVar9 + 0x6c8))(1,&this->m_fb_vbo_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x398);
  (**(code **)(lVar9 + 0x40))(0x8892,this->m_fb_vbo_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x39c);
  (**(code **)(lVar9 + 0x150))(0x8892,0x40,vertices,0x88e4);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error setting data for buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x3a0);
  (**(code **)(lVar9 + 0x1680))(this->m_fb_po_id);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x3a3);
  GVar7 = (**(code **)(lVar9 + 0x780))(this->m_fb_po_id,"inPosition");
  this->m_position_location = GVar7;
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x3a6);
  if (this->m_position_location != -1) {
    (**(code **)(lVar9 + 0x19f0))(this->m_position_location,4,0x1406,0,0,0);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Could not set vertex attribute pointer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3ad);
    (**(code **)(lVar9 + 0x610))(this->m_position_location);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Could not enable vertex attribute array!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3b0);
    (**(code **)(lVar9 + 0x1c0))(0,0,0,0);
    (**(code **)(lVar9 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error clearing color buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3b5);
    (**(code **)(lVar9 + 0x538))(5,0,4);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Rendering failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3b9);
    (**(code **)(lVar9 + 0x78))(0x8ca8,*pGVar1);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error binding frame buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3bc);
    (**(code **)(lVar9 + 0x40))(0x88eb,(this->super_TextureBufferOperations).m_tb_bo_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error binding buffer object !",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3c0);
    (**(code **)(lVar9 + 0xff0))(0xcf5,1);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error setting GL_UNPACK_ALIGNMENT parameter to 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3c3);
    (**(code **)(lVar9 + 0xff0))(0xd05,1);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error setting GL_PACK_ALIGNMENT parameter to 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3c6);
    (**(code **)(lVar9 + 0x1220))
              (0,0,(this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture,1,0x8d99,
               0x1404,0);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error reading pixels !",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3ca);
    (**(code **)(lVar9 + 0xff0))(0xcf5,4);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error setting GL_UNPACK_ALIGNMENT parameter to default value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3cd);
    (**(code **)(lVar9 + 0xff0))(0xd05,4);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error setting GL_PACK_ALIGNMENT parameter to default value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3d0);
    (**(code **)(lVar9 + 0x40))(0x88eb,0);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3d3);
    (**(code **)(lVar9 + 0x40))
              ((this->super_TextureBufferOperations).super_TestCaseBase.m_glExtTokens.TEXTURE_BUFFER
               ,(this->super_TextureBufferOperations).m_tb_bo_id);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x3d6);
    (**(code **)(lVar9 + 0xd8))(0);
    (**(code **)(lVar9 + 0xb8))(0xde1,0);
    (**(code **)(lVar9 + 0x78))(0x8ca9,0);
    (**(code **)(lVar9 + 0x78))(0x8ca8,0);
    (**(code **)(lVar9 + 0x40))(0x8892,0);
    uVar8 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
              _vptr_RenderContext[2])();
    if ((uVar8 & 0x300) == 0) {
      (**(code **)(lVar9 + 0x518))(this->m_position_location);
    }
    (**(code **)(lVar9 + 0x1680))(0);
    this->m_position_location = -1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vsSource._M_dataplus._M_p != &vsSource.field_2) {
      operator_delete(vsSource._M_dataplus._M_p,vsSource.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fsSource._M_dataplus._M_p != &fsSource.field_2) {
      operator_delete(fsSource._M_dataplus._M_p,fsSource.field_2._M_allocated_capacity + 1);
    }
    if (data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,"Could not get uniform location",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
             ,0x3a9);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferOperationsViaFrambufferReadBack::initializeBufferObjectData()
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::vector<glw::GLint> data(m_n_vectors_in_buffer_texture * m_n_vector_components);
	fillBufferWithData(&data[0], m_n_vectors_in_buffer_texture * m_n_vector_components);

	/* Configure vertex array object */
	gl.genVertexArrays(1, &m_fb_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating vertex array object!");

	gl.bindVertexArray(m_fb_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Prepare framebuffer object */
	gl.genFramebuffers(1, &m_fb_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error genertaing framebuffer object!");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fb_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object!");

	/* Prepare texture object */
	gl.genTextures(1, &m_fb_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.bindTexture(GL_TEXTURE_2D, m_fb_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32I, m_n_vectors_in_buffer_texture /* width */, 1 /* height */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's data store!");

	/* Attach texture to framebuffer */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_fb_to_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to framebuffer's color attachment!");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	/* Configure view port */
	gl.viewport(0, 0, m_n_vectors_in_buffer_texture, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting viewport!");

	/* Create program object */
	m_fb_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_fb_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating fragment shader object!");

	m_fb_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating vertex shader object!");

	std::string fsSource = getFBFragmentShaderCode();
	std::string vsSource = getFBVertexShaderCode();

	const char* fsCode = fsSource.c_str();
	const char* vsCode = vsSource.c_str();

	if (!buildProgram(m_fb_po_id, m_fb_fs_id, 1, &fsCode, m_fb_vs_id, 1, &vsCode))
	{
		TCU_FAIL("Could not create a program from valid vertex/fragment shader code!");
	}

	/* Full screen quad */
	glw::GLfloat vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
								1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };

	/* Generate buffer object */
	gl.genBuffers(1, &m_fb_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");

	/* Bind buffer object */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_fb_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	/* Set data for buffer object */
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting data for buffer object!");

	gl.useProgram(m_fb_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	m_position_location = gl.getAttribLocation(m_fb_po_id, "inPosition");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");
	if (m_position_location == -1)
	{
		TCU_FAIL("Could not get uniform location");
	}

	gl.vertexAttribPointer(m_position_location, 4, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Clear texture */
	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error clearing color buffer");

	/* Render */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fb_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding frame buffer object!");

	/* Bind buffer object to pixel pack buffer */
	gl.bindBuffer(GL_PIXEL_PACK_BUFFER, m_tb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object !");

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_UNPACK_ALIGNMENT parameter to 1");

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_PACK_ALIGNMENT parameter to 1");

	/* Fill buffer object with data from framebuffer object's color attachment */
	gl.readPixels(0, 0, m_n_vectors_in_buffer_texture, 1, GL_RGBA_INTEGER, GL_INT, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels !");

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_UNPACK_ALIGNMENT parameter to default value");

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_PACK_ALIGNMENT parameter to default value");

	gl.bindBuffer(GL_PIXEL_PACK_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	gl.bindVertexArray(0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		gl.disableVertexAttribArray(m_position_location);

	gl.useProgram(0);

	m_position_location = -1;
}